

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_> *
__thiscall Json::OurReader::getStructuredErrors(OurReader *this)

{
  bool bVar1;
  value_type *in_RSI;
  _Self *in_RDI;
  StructuredError structured;
  ErrorInfo *error;
  const_iterator itError;
  vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
  *allErrors;
  _Self *__x;
  vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
  *in_stack_ffffffffffffff60;
  string local_80 [32];
  reference local_60;
  _Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
  local_38;
  undefined1 local_11;
  
  local_11 = 0;
  __x = in_RDI;
  std::vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>::
  vector((vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
          *)0x14befd);
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::begin
            ((deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_> *)
             in_RDI);
  while( true ) {
    std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::end
              ((deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_> *)
               in_RDI);
    bVar1 = std::operator!=(__x,in_RDI);
    if (!bVar1) break;
    local_60 = std::
               _Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
               ::operator*(&local_38);
    StructuredError::StructuredError((StructuredError *)0x14bf5d);
    std::__cxx11::string::operator=(local_80,(string *)&local_60->message_);
    std::vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
    ::push_back(in_stack_ffffffffffffff60,in_RSI);
    StructuredError::~StructuredError((StructuredError *)0x14bfc1);
    std::
    _Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
    ::operator++(__x);
  }
  return (vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
          *)__x;
}

Assistant:

std::vector<OurReader::StructuredError> OurReader::getStructuredErrors() const {
  std::vector<OurReader::StructuredError> allErrors;
  for (Errors::const_iterator itError = errors_.begin();
       itError != errors_.end();
       ++itError) {
    const ErrorInfo& error = *itError;
    OurReader::StructuredError structured;
    structured.offset_start = error.token_.start_ - begin_;
    structured.offset_limit = error.token_.end_ - begin_;
    structured.message = error.message_;
    allErrors.push_back(structured);
  }
  return allErrors;
}